

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmp_math.cpp
# Opt level: O2

double getStandartDeviation(TRIPLERGB **mrx,int h,int w,int component,double E)

{
  byte bVar1;
  int iVar2;
  int iVar3;
  int i;
  int j;
  int j_00;
  undefined8 local_48;
  
  i = 0;
  iVar3 = 0;
  if (0 < w) {
    iVar3 = w;
  }
  iVar2 = 0;
  if (0 < h) {
    iVar2 = h;
  }
  local_48 = 0.0;
  for (; i != iVar2; i = i + 1) {
    for (j_00 = 0; iVar3 != j_00; j_00 = j_00 + 1) {
      bVar1 = getComponent((TRIPLEBYTES **)mrx,i,j_00,component);
      local_48 = local_48 + ((double)bVar1 - E) * ((double)bVar1 - E);
    }
  }
  return local_48 / (double)(w * h);
}

Assistant:

double getStandartDeviation(TRIPLERGB **mrx, int h, int w, int component, double E) {
    double count = 0;
    for (int i = 0; i < h; i++) {
        for (int j = 0; j < w; j++) {
            count += pow((double) getComponent((TRIPLEBYTES **) mrx, i, j, component) - E, 2);
        }
    }
    return count / (w * h);
}